

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringDatatypeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::StringDatatypeValidator::assignAdditionalFacet
          (StringDatatypeValidator *this,XMLCh *key,XMLCh *value,MemoryManager *manager)

{
  byte *pbVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  short sVar4;
  XMLCh *pXVar5;
  InvalidDatatypeFacetException *this_00;
  XMLCh *pXVar6;
  
  if (key != L"whiteSpace") {
    pXVar5 = L"whiteSpace";
    pXVar6 = key;
    if (key == (XMLCh *)0x0) {
LAB_002fbb7a:
      if (*pXVar5 == L'\0') goto LAB_002fbb80;
    }
    else {
      do {
        XVar2 = *pXVar6;
        if (XVar2 == L'\0') goto LAB_002fbb7a;
        XVar3 = *pXVar5;
        pXVar5 = pXVar5 + 1;
        pXVar6 = pXVar6 + 1;
      } while (XVar2 == XVar3);
    }
    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/StringDatatypeValidator.cpp"
               ,0x6a,FACET_Invalid_Tag,key,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
    goto LAB_002fbb64;
  }
LAB_002fbb80:
  if (value == L"preserve") {
LAB_002fbbee:
    sVar4 = 0;
  }
  else {
    pXVar5 = L"preserve";
    pXVar6 = value;
    if (value == (XMLCh *)0x0) {
LAB_002fbbb2:
      if (*pXVar5 == L'\0') goto LAB_002fbbee;
    }
    else {
      do {
        XVar2 = *pXVar6;
        if (XVar2 == L'\0') goto LAB_002fbbb2;
        XVar3 = *pXVar5;
        pXVar5 = pXVar5 + 1;
        pXVar6 = pXVar6 + 1;
      } while (XVar2 == XVar3);
    }
    sVar4 = 1;
    if (value != L"replace") {
      pXVar5 = L"replace";
      pXVar6 = value;
      if (value == (XMLCh *)0x0) {
LAB_002fbc04:
        if (*pXVar5 == L'\0') goto LAB_002fbbf0;
      }
      else {
        do {
          XVar2 = *pXVar6;
          if (XVar2 == L'\0') goto LAB_002fbc04;
          XVar3 = *pXVar5;
          pXVar5 = pXVar5 + 1;
          pXVar6 = pXVar6 + 1;
        } while (XVar2 == XVar3);
      }
      sVar4 = 2;
      if (value != L"collapse") {
        pXVar5 = L"collapse";
        pXVar6 = value;
        if (value == (XMLCh *)0x0) {
LAB_002fbc7b:
          if (*pXVar5 == L'\0') goto LAB_002fbbf0;
        }
        else {
          do {
            XVar2 = *pXVar6;
            if (XVar2 == L'\0') goto LAB_002fbc7b;
            XVar3 = *pXVar5;
            pXVar5 = pXVar5 + 1;
            pXVar6 = pXVar6 + 1;
          } while (XVar2 == XVar3);
        }
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/StringDatatypeValidator.cpp"
                   ,0x60,FACET_Invalid_WS,value,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
LAB_002fbb64:
        __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
      }
    }
  }
LAB_002fbbf0:
  (this->super_AbstractStringValidator).super_DatatypeValidator.fWhiteSpace = sVar4;
  pbVar1 = (byte *)((long)&(this->super_AbstractStringValidator).super_DatatypeValidator.
                           fFacetsDefined + 1);
  *pbVar1 = *pbVar1 | 0x40;
  return;
}

Assistant:

void StringDatatypeValidator::assignAdditionalFacet(const XMLCh* const key
                                                  , const XMLCh* const value
                                                  , MemoryManager* const manager)
{
    if (XMLString::equals(key, SchemaSymbols::fgELT_WHITESPACE))
    {
        // whiteSpace = preserve | replace | collapse
        if (XMLString::equals(value, SchemaSymbols::fgWS_PRESERVE))
            setWhiteSpace(DatatypeValidator::PRESERVE);
        else if (XMLString::equals(value, SchemaSymbols::fgWS_REPLACE))
            setWhiteSpace(DatatypeValidator::REPLACE);
        else if (XMLString::equals(value, SchemaSymbols::fgWS_COLLAPSE))
            setWhiteSpace(DatatypeValidator::COLLAPSE);
        else
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_WS, value, manager);
        //("whiteSpace value '" + ws + "' must be one of 'preserve', 'replace', 'collapse'.");

        setFacetsDefined(DatatypeValidator::FACET_WHITESPACE);
    }
    else
    {
        ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                , XMLExcepts::FACET_Invalid_Tag
                , key
                , manager);
    }
}